

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void CVmBifTADS::toString(uint argc)

{
  vm_val_t *pvVar1;
  int radix;
  uint uVar2;
  
  CVmBif::check_argc_range(argc,1,3);
  pvVar1 = sp_;
  if (argc < 2) {
    radix = 10;
  }
  else {
    radix = vm_val_t::num_to_int(sp_ + -2);
    if (radix - 0x25U < 0xffffffdd) {
      err_throw(0x902);
    }
    if (argc != 2) {
      uVar2 = vm_val_t::get_logical_only(sp_ + -3);
      goto LAB_0022224f;
    }
  }
  uVar2 = (uint)(radix == 10);
LAB_0022224f:
  toString(&r0_,pvVar1 + -1,radix,(uint)(uVar2 == 0));
  sp_ = sp_ + -(long)(int)argc;
  return;
}

Assistant:

void CVmBifTADS::toString(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 3);

    /* get the argument */
    vm_val_t *val = G_stk->get(0);

    /* if there's a radix specified, pop it as well */
    int radix = (argc >= 2 ? G_stk->get(1)->num_to_int(vmg0_) : 10);

    /* the radix must be from 2 to 36 */
    if (radix < 2 || radix > 36)
        err_throw(VMERR_BAD_VAL_BIF);

    /* assume unsigned */
    int flags = TOSTR_UNSIGNED;;

    /* 
     *   If the 'isSigned' argument is present, pop it as a bool; otherwise
     *   treat the value as signed if the radix is decimal, otherwise
     *   unsigned. 
     */
    if (argc >= 3 ? G_stk->get(2)->get_logical_only() : radix == 10)
        flags &= ~TOSTR_UNSIGNED;

    /* convert the value */
    toString(vmg_ G_interpreter->get_r0(), val, radix, flags);

    /* discard arguments */
    G_stk->discard(argc);
}

/*
 *   explicitly convert to string 
 */
void CVmBifTADS::toString(VMG_ vm_val_t *result, const vm_val_t *val,
                          int radix, int flags)
{
    /* do the basic string conversion */
    char buf[50];
    const char *p = CVmObjString::cvt_to_str(
        vmg_ result, buf, sizeof(buf), val, radix, flags);

    /* save the new string on the stack to protect from garbage collection */
    G_stk->push(result);

    /* 
     *   if the return value wasn't already a new object, create a string
     *   from the return value 
     */
    if (result->typ != VM_OBJ)
    {
        /* we just have a string in a buffer - create a new string from it */
        result->set_obj(CVmObjString::create(
            vmg_ FALSE, p + VMB_LEN, vmb_get_len(p)));
    }

    /* discard gc protection */
    G_stk->discard(1);
}

/*
 *   toInteger - convert to an integer
 */
void CVmBifTADS::toInteger(VMG_ uint argc)
{
    /* convert as an integer only */
    toIntOrNum(vmg_ argc, TRUE);
}

/*
 *   toNumber - convert to an integer or BigNumber 
 */
void CVmBifTADS::toNumber(VMG_ uint argc)
{
    /* convert as integer or BigNumber */
    toIntOrNum(vmg_ argc, FALSE);
}

/*
 *   Common handler for toInteger and toNumber 
 */
void CVmBifTADS::toIntOrNum(VMG_ uint argc, int int_only)
{    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* check for BigNumber values */
    vm_val_t *valp = G_stk->get(0);
    if (valp->typ == VM_OBJ
        && CVmObjBigNum::is_bignum_obj(vmg_ valp->val.obj))
    {
        /*
         *   If we only want integer results, try converting the BigNumber to
         *   an integer.  Otherwise, simply return the BigNumber as-is. 
         */
        if (int_only)
        {
            /* we only want an integer result - convert to int */
            long intval = ((CVmObjBigNum *)vm_objp(vmg_ valp->val.obj))
                          ->convert_to_int();

            /* return the integer value */
            retval_int(vmg_ intval);
        }
        else
        {
            /* BigNumber results are okay - just return the BigNumber */
            retval(vmg_ valp);
        }
        
        /* discard arguments, and we're done */
        G_stk->discard(argc);
        return;
    }

    /* if it's already an integer, just return the same value */
    if (valp->typ == VM_INT)
    {
        /* just return the argument value */
        retval_int(vmg_ valp->val.intval);

        /* discard arguments and return */
        G_stk->discard(argc);
        return;
    }

    /* if it's true or nil, convert to 1 or 0 */
    if (valp->typ == VM_TRUE || valp->typ == VM_NIL)
    {
        /* return 1 for true, 0 for nil */
        retval_int(vmg_ valp->typ == VM_TRUE ? 1 : 0);
        G_stk->discard(argc);
        return;
    }

    /* the only other type of value we can convert is a string */
    const char *strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a radix specified, pop it as well; the default is 10 */
    int radix = 10;
    if (argc >= 2)
    {
        /* get the radix from the stack */
        radix = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's in the valid range */
        if (radix < 2 || radix > 36)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get a version of the string stripped of leading and trailing spaces */
    const char *p2 = strp;
    size_t len2 = len;
    for ( ; len2 != 0 && is_space(*p2) ; ++p2, --len2) ;
    for ( ; len2 != 0 && is_space(*(p2 + len2 - 1)) ; --len2) ;

    /* 
     *   Check for "nil" and "true", ignoring leading and trailing spaces; if
     *   it matches either of those, return the corresponding boolean value.
     *   Otherwise, parse the string as an integer value in the given radix.
     */
    if (len2 == 3 && memcmp(p2, "nil", 3) == 0)
    {
        /* the value for "nil" is 0 */
        retval_int(vmg_ 0);
    }
    else if (len2 == 4 && memcmp(p2, "true", 4) == 0)
    {
        /* the value for "true" is 1 */
        retval_int(vmg_ 1);
    }
    else
    {
        /* parse the string as an integer (orBigNumber if it's too large) */
        vm_val_t val;
        CVmObjString::parse_num_val(vmg_ &val, strp, len, radix, int_only);
        retval(vmg_ &val);
    }

    /* discard arguments */
    G_stk->discard(argc);
}

/* ------------------------------------------------------------------------ */
/*
 *   put an integer value in a constant list, advancing the list write
 *   pointer 
 */
static void put_list_int(char **dstp, long intval)
{
    /* set up the integer value */
    vm_val_t val;
    val.set_int(intval);

    /* write it to the list */
    vmb_put_dh(*dstp, &val);

    /* advance the output pointer */
    *dstp += VMB_DATAHOLDER;
}

/*
 *   put an object value in a constant list, advancing the list write
 *   pointer 
 */
static void put_list_obj(char **dstp, vm_obj_id_t objval)
{
    vm_val_t val;

    /* set up the integer value */
    val.set_obj(objval);

    /* write it to the list */
    vmb_put_dh(*dstp, &val);

    /* advance the output pointer */
    *dstp += VMB_DATAHOLDER;
}


/*
 *   Given a time_t value, create a list of components giving the local time
 *   corresponding to the time_t, using the getTime(GetDateAndTime) format.
 *   Returns the object ID of the new list.
 *   
 *   The list format is [year, month, day, day-of-week, day-of-year, hour,
 *   minute, second, seconds-since-1970].
 */
vm_obj_id_t CVmBifTADS::format_datetime_list(VMG_ os_time_t timer)
{
    /* note the starting stack pointer, so we can discard gc protection */
    vm_val_t *gsp = G_stk->get_sp();
    
    /* convert the time_t to the local time */
    struct tm *tblock = os_localtime(&timer);

    /* start the list buffer - set the length (9 elements) */
    char buf[80];
    vmb_put_len(buf, 9);
    char *dst = buf + VMB_LEN;
    
    /* add the time elements to the list */
    put_list_int(&dst, tblock->tm_year + 1900);
    put_list_int(&dst, tblock->tm_mon + 1);
    put_list_int(&dst, tblock->tm_mday);
    put_list_int(&dst, tblock->tm_wday + 1);
    put_list_int(&dst, tblock->tm_yday + 1);
    put_list_int(&dst, tblock->tm_hour);
    put_list_int(&dst, tblock->tm_min);
    put_list_int(&dst, tblock->tm_sec);

    /* 
     *   if the timer is over 0x7fffffff, we can't represent it as an
     *   int32_t, so store it as a BigNumber value
     */
    if (timer <= 0x7fffffffU)
    {
        /* it'll fit in an ordinary 32-bit signed int */
        put_list_int(&dst, (uint32_t)timer);
    }
    else
    {
        /* it won't fit an int32, so convert to BigNumber */
        vm_obj_id_t bn;
        if (sizeof(timer) <= 4)
        {
            /* os_time_t must be a uint32 */
            bn = CVmObjBigNum::createu(vmg_ FALSE, (ulong)timer, 10);
        }
        else
        {
            /* os_time_t must be 64 bits (or larger) */
            bn = CVmObjBigNum::create_int64(
                vmg_ FALSE, (uint32_t)(timer >> 32),
                (uint32_t)(timer & 0xFFFFFFFF));
        }

        /* save it on the stack for gc protection */
        G_stk->push()->set_obj(bn);
        
        /* add it to the list */
        put_list_obj(&dst, bn);
    }

    /* create a list from the formatted buffer, and return its object ID */
    vm_obj_id_t lst = CVmObjList::create(vmg_ FALSE, buf);

    /* discard gc protection */
    G_stk->set_sp(gsp);

    /* return the list */
    return lst;
}

/*
 *   get the current time 
 */
void CVmBifTADS::gettime(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 0, 1);

    /* if there's an argument, get the type of time value to return */
    int typ;
    if (argc == 1)
    {
        /* get the time type code */
        typ = pop_int_val(vmg0_);
    }
    else
    {
        /* use the default type */
        typ = 1;
    }

    /* check the type */
    switch(typ)
    {
    case 1:
        /* 
         *   GetTimeDateAndTime - return the current time and date as a list
         *   of time elements
         */

        /* get the current system time and format it into our list */
        retval_obj(vmg_ format_datetime_list(vmg_ os_time(NULL)));

        /* done */
        break;

    case 2:
        /* 
         *   They want the high-precision system timer value, which returns
         *   the time in milliseconds from an arbitrary zero point.  
         */
        {
            unsigned long t;
            static unsigned long t_zero;
            static int t_zero_set = FALSE;

            /* retrieve the raw time from the operating system */
            t = os_get_sys_clock_ms();

            /* 
             *   We only have 31 bits of precision in our result (since we
             *   must fit the value into a signed integer), so we can only
             *   represent time differences of about 23 days.  Now, the
             *   value from the OS could be at any arbitrary point in our
             *   23-day range, so there's a nontrivial probability that the
             *   raw OS value is near enough to the wrapping point that a
             *   future call to this same function during the current
             *   session could encounter the wrap condition.  The caller is
             *   likely to be confused by this, because the time difference
             *   from this call to that future call would appear to be
             *   negative.
             *   
             *   There's obviously no way we can eliminate the possibility
             *   of a negative time difference if the current program
             *   session lasts more than 23 days of continuous execution.
             *   Fortunately, it seems unlikely that most sessions will be
             *   so long, which gives us a way to reduce the likelihood that
             *   the program will encounter a wrapped timer: we can adjust
             *   the zero point of the timer to the time of the first call
             *   to this function.  That way, the timer will wrap only if
             *   the program session runs continuously until the timer's
             *   range is exhausted.  
             */
            if (!t_zero_set)
            {
                /* this is the first call - remember the zero point */
                t_zero = t;
                t_zero_set = TRUE;
            }

            /* 
             *   Adjust the time by subtracting the zero point from the raw
             *   OS timer.  This will give us the number of milliseconds
             *   from our zero point.
             *   
             *   If the system timer has wrapped since our zero point, we'll
             *   get what looks like a negative number; but what we really
             *   have is a large positive number with a borrow from an
             *   unrepresented higher-precision portion, so the fact that
             *   this value is negative doesn't matter - it will still be
             *   sequential when treated as unsigned.  
             */
            t -= t_zero;

            /* 
             *   whatever we got, keep only the low-order 31 bits, since we
             *   only have 31 bits in which to represent an unsigned value
             */
            t &= 0x7fffffff;

            /* return the value we've calculated */
            retval_int(vmg_ t);
        }
        break;

    default:
        err_throw(VMERR_BAD_VAL_BIF);
    }
}